

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::VisibilityString(uint Visibility)

{
  undefined1 auStack_18 [4];
  uint Visibility_local;
  
  if (Visibility == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIS_local");
  }
  else if (Visibility == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIS_exported");
  }
  else if (Visibility == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIS_qualified");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::VisibilityString(unsigned Visibility) {
  switch (Visibility) {
  case DW_VIS_local:
    return "DW_VIS_local";
  case DW_VIS_exported:
    return "DW_VIS_exported";
  case DW_VIS_qualified:
    return "DW_VIS_qualified";
  }
  return StringRef();
}